

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles2::Functional::PointCoordCase::iterate(PointCoordCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  RenderContext *pRVar2;
  ulong uVar3;
  PointCoordCase *pPVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  RenderTarget *pRVar9;
  pointer pbVar10;
  pointer pbVar11;
  TestError *pTVar12;
  ulong uVar13;
  char *description;
  int iVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  iterator coord;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float pointSizeRange [2];
  Surface refImg;
  Surface testImg;
  Random rnd;
  ProgramSources sources;
  ShaderProgram program;
  undefined8 local_2a0;
  PointCoordCase *local_298;
  value_type local_290;
  Surface local_270;
  undefined1 local_258 [8];
  char *pcStack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  int local_230;
  float local_228;
  float local_224;
  float local_220;
  RGBA local_21c;
  TestLog *local_218;
  pointer local_210;
  pointer local_208;
  ulong local_200;
  Surface local_1f8;
  deRandom local_1e0;
  undefined1 local_1d0 [8];
  _Alloc_hider local_1c8;
  undefined1 local_1c0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  int local_1a8;
  pointer local_1a0;
  pointer pbStack_198;
  int local_190;
  pointer local_188;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_140;
  undefined1 local_120 [32];
  ShaderProgram local_100;
  long lVar8;
  
  local_218 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar9->m_width;
  if (0xff < iVar6) {
    iVar6 = 0x100;
  }
  pRVar9 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar17 = 0x100;
  if (pRVar9->m_height < 0x100) {
    iVar17 = pRVar9->m_height;
  }
  pbVar10 = (pointer)operator_new(0x60);
  (pbVar10->_M_dataplus)._M_p = (pointer)0x0;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pbVar10->field_2 + 8) = 0;
  pbVar10[1]._M_dataplus._M_p = (pointer)0x0;
  pbVar10[1]._M_string_length = 0;
  pbVar10[1].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pbVar10[1].field_2 + 8) = 0;
  pbVar10[2]._M_dataplus._M_p = (pointer)0x0;
  pbVar10[2]._M_string_length = 0;
  pbVar10[2].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pbVar10[2].field_2 + 8) = 0;
  local_2a0 = 0;
  deRandom_init(&local_1e0,0x145fa);
  tcu::Surface::Surface(&local_1f8,iVar6,iVar17);
  tcu::Surface::Surface(&local_270,iVar6,iVar17);
  (**(code **)(lVar8 + 0x818))(0x846d,&local_2a0);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glGetFloatv(GL_ALIASED_POINT_SIZE_RANGE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderBuiltinVarTests.cpp"
                  ,0x1db);
  if ((((float)local_2a0 <= 0.0) || (local_2a0._4_4_ <= 0.0)) ||
     (local_2a0._4_4_ < (float)local_2a0)) {
    pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
    local_100.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)&local_100.m_shaders[0].
                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"Invalid GL_ALIASED_POINT_SIZE_RANGE","");
    tcu::TestError::TestError(pTVar12,(string *)&local_100);
    __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_210 = pbVar10 + 3;
  pbVar11 = pbVar10;
  do {
    fVar21 = deRandom_getFloat(&local_1e0);
    *(float *)&(pbVar11->_M_dataplus)._M_p = fVar21 * 1.8 + -0.9;
    fVar21 = deRandom_getFloat(&local_1e0);
    *(float *)((long)&(pbVar11->_M_dataplus)._M_p + 4) = fVar21 * 1.8 + -0.9;
    fVar21 = (float)local_2a0;
    fVar23 = local_2a0._4_4_;
    fVar22 = deRandom_getFloat(&local_1e0);
    *(float *)&pbVar11->_M_string_length = (fVar23 - fVar21) * fVar22 + fVar21;
    pbVar11 = (pointer)((long)&pbVar11->_M_string_length + 4);
  } while (pbVar11 != local_210);
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  local_298 = this;
  local_258 = (undefined1  [8])&local_248;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_258,
             "attribute highp vec3 a_positionSize;\nvoid main (void)\n{\n\tgl_Position = vec4(a_positionSize.xy, 0.0, 1.0);\n\tgl_PointSize = a_positionSize.z;\n}\n"
             ,"");
  paVar1 = &local_290.field_2;
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,
             "void main (void)\n{\n\tgl_FragColor = vec4(gl_PointCoord, 0.0, 1.0);\n}\n","");
  local_120[0x10] = 0;
  local_120._17_8_ = 0;
  local_120._0_8_ = (pointer)0x0;
  local_120[8] = 0;
  local_120._9_7_ = 0;
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1d0,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1d0,(value_type *)local_258);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8,&local_290);
  glu::ShaderProgram::ShaderProgram(&local_100,pRVar2,(ProgramSources *)local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_120);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_140);
  lVar15 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1d0 + lVar15));
    lVar15 = lVar15 + -0x18;
  } while (lVar15 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if (local_258 != (undefined1  [8])&local_248) {
    operator_delete((void *)local_258,local_248._M_allocated_capacity + 1);
  }
  glu::operator<<(local_218,&local_100);
  if (local_100.m_program.m_info.linkOk != false) {
    local_290._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"a_positionSize","");
    local_258._0_4_ = A;
    pcStack_250 = local_248._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pcStack_250,local_290._M_dataplus._M_p,
               local_290._M_dataplus._M_p + local_290._M_string_length);
    local_230 = 0;
    local_1d0._0_4_ = local_258._0_4_;
    local_1c8._M_p = (pointer)&local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcStack_250,pcStack_250 + local_248._M_allocated_capacity);
    local_1a8 = local_230;
    local_1a0 = (pointer)0x8;
    pbStack_198 = (pointer)0x800000003;
    local_190 = 0;
    local_188 = pbVar10;
    if (pcStack_250 != local_248._M_local_buf + 8) {
      operator_delete(pcStack_250,local_248._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != paVar1) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    pRVar9 = Context::getRenderTarget((local_298->super_TestCase).m_context);
    iVar14 = pRVar9->m_width;
    dVar7 = deRandom_getUint32(&local_1e0);
    uVar13 = (ulong)dVar7 % (ulong)((iVar14 - iVar6) + 1);
    pRVar9 = Context::getRenderTarget((local_298->super_TestCase).m_context);
    iVar14 = pRVar9->m_height;
    dVar7 = deRandom_getUint32(&local_1e0);
    uVar3 = (ulong)dVar7 % (ulong)((iVar14 - iVar17) + 1);
    (**(code **)(lVar8 + 0x1a00))(uVar13,uVar3,iVar6,iVar17);
    (**(code **)(lVar8 + 0x1c0))();
    (**(code **)(lVar8 + 0x188))(0x4000);
    (**(code **)(lVar8 + 0x1680))(local_100.m_program.m_program);
    pPVar4 = local_298;
    local_258._0_4_ = RA;
    local_258._4_4_ = UNORM_SHORT_565;
    pcStack_250 = (char *)CONCAT44(pcStack_250._4_4_,3);
    local_248._M_allocated_capacity = 0;
    glu::draw(((local_298->super_TestCase).m_context)->m_renderCtx,local_100.m_program.m_program,1,
              (VertexArrayBinding *)local_1d0,(PrimitiveList *)local_258,(DrawUtilCallback *)0x0);
    pRVar2 = ((pPVar4->super_TestCase).m_context)->m_renderCtx;
    local_290._M_dataplus._M_p = (pointer)0x300000008;
    if ((void *)local_1f8.m_pixels.m_cap != (void *)0x0) {
      local_1f8.m_pixels.m_cap = (size_t)local_1f8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_258,(TextureFormat *)&local_290,local_1f8.m_width,
               local_1f8.m_height,1,(void *)local_1f8.m_pixels.m_cap);
    glu::readPixels(pRVar2,(int)uVar13,(int)uVar3,(PixelBufferAccess *)local_258);
    dVar7 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar7,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fShaderBuiltinVarTests.cpp"
                    ,0x20d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_p != &local_1b8) {
      operator_delete(local_1c8._M_p,local_1b8._M_allocated_capacity + 1);
    }
    local_258._0_4_ = RGBA;
    local_258._4_4_ = UNORM_INT8;
    if ((void *)local_270.m_pixels.m_cap != (void *)0x0) {
      local_270.m_pixels.m_cap = (size_t)local_270.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1d0,(TextureFormat *)local_258,local_270.m_width,
               local_270.m_height,1,(void *)local_270.m_pixels.m_cap);
    local_258 = (undefined1  [8])0;
    pcStack_250 = (char *)0x3f80000000000000;
    tcu::clear((PixelBufferAccess *)local_1d0,(Vec4 *)local_258);
    local_228 = (float)iVar6;
    local_224 = (float)iVar17;
    pbVar11 = pbVar10;
    do {
      fVar23 = *(float *)&pbVar11->_M_string_length * -0.5;
      fVar22 = (*(float *)((long)&(pbVar11->_M_dataplus)._M_p + 4) * 0.5 + 0.5) * local_224;
      fVar21 = fVar22 + fVar23;
      uVar19 = -(uint)(fVar21 < 0.0);
      uVar19 = (uint)((float)(~uVar19 & 0x3f000000 | uVar19 & 0xbf000000) + fVar21);
      uVar13 = (ulong)uVar19;
      fVar21 = *(float *)&pbVar11->_M_string_length * 0.5;
      fVar22 = fVar22 + fVar21;
      uVar20 = -(uint)(fVar22 < 0.0);
      uVar19 = (int)((float)(~uVar20 & 0x3f000000 | uVar20 & 0xbf000000) + fVar22) - uVar19;
      local_208 = pbVar11;
      local_200 = uVar13;
      if (0 < (int)uVar19) {
        fVar22 = (*(float *)&(pbVar11->_M_dataplus)._M_p * 0.5 + 0.5) * local_228;
        fVar23 = fVar23 + fVar22;
        uVar20 = -(uint)(fVar23 < 0.0);
        iVar17 = (int)((float)(~uVar20 & 0x3f000000 | uVar20 & 0xbf000000) + fVar23);
        fVar22 = fVar22 + fVar21;
        uVar20 = -(uint)(fVar22 < 0.0);
        iVar6 = (int)((float)(~uVar20 & 0x3f000000 | uVar20 & 0xbf000000) + fVar22) - iVar17;
        local_220 = (float)(int)uVar19;
        uVar20 = 0;
        do {
          if (0 < iVar6) {
            fVar21 = ((float)(int)(~uVar20 + uVar19) + 0.5) / local_220;
            iVar16 = uVar20 + (int)local_200;
            iVar14 = 0;
            do {
              local_1d0._4_4_ = fVar21;
              local_1d0._0_4_ = ((float)iVar14 + 0.5) / (float)iVar6;
              local_1c8._M_p = (pointer)0x3f80000000000000;
              iVar18 = iVar17 + iVar14;
              if (((-1 < iVar18) && (iVar18 < local_270.m_width)) &&
                 ((-1 < iVar16 && (iVar16 < local_270.m_height)))) {
                tcu::RGBA::RGBA(&local_21c,(Vec4 *)local_1d0);
                *(deUint32 *)
                 ((long)local_270.m_pixels.m_ptr +
                 (long)(iVar18 + local_270.m_width * (int)uVar13) * 4) = local_21c.m_value;
              }
              iVar14 = iVar14 + 1;
            } while (iVar6 != iVar14);
          }
          uVar20 = uVar20 + 1;
          uVar13 = (ulong)((int)uVar13 + 1);
        } while (uVar20 != uVar19);
      }
      pbVar11 = (pointer)((long)&local_208->_M_string_length + 4);
    } while (pbVar11 != local_210);
    bVar5 = tcu::fuzzyCompare(local_218,"Result","Image comparison result",&local_270,&local_1f8,
                              0.02,COMPARE_LOG_RESULT);
    description = "Image comparison failed";
    if (bVar5) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((local_298->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,
               description);
    glu::ShaderProgram::~ShaderProgram(&local_100);
    tcu::Surface::~Surface(&local_270);
    tcu::Surface::~Surface(&local_1f8);
    operator_delete(pbVar10,0x60);
    return STOP;
  }
  pTVar12 = (TestError *)__cxa_allocate_exception(0x38);
  local_1d0 = (undefined1  [8])local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Compile failed","");
  tcu::TestError::TestError(pTVar12,(string *)local_1d0);
  __cxa_throw(pTVar12,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&				log			= m_testCtx.getLog();
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const int				width		= de::min(256, m_context.getRenderTarget().getWidth());
		const int				height		= de::min(256, m_context.getRenderTarget().getHeight());
		const float				threshold	= 0.02f;

		const int				numPoints	= 8;

		vector<tcu::Vec3>		coords		(numPoints);
		float					pointSizeRange[2]	= { 0.0f, 0.0f };

		de::Random				rnd			(0x145fa);
		tcu::Surface			testImg		(width, height);
		tcu::Surface			refImg		(width, height);

		gl.getFloatv(GL_ALIASED_POINT_SIZE_RANGE, &pointSizeRange[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetFloatv(GL_ALIASED_POINT_SIZE_RANGE)");

		if (pointSizeRange[0] <= 0.0f || pointSizeRange[1] <= 0.0f || pointSizeRange[1] < pointSizeRange[0])
			throw tcu::TestError("Invalid GL_ALIASED_POINT_SIZE_RANGE");

		// Compute coordinates.
		{

			for (vector<tcu::Vec3>::iterator coord = coords.begin(); coord != coords.end(); ++coord)
			{
				coord->x() = rnd.getFloat(-0.9f, 0.9f);
				coord->y() = rnd.getFloat(-0.9f, 0.9f);
				coord->z() = rnd.getFloat(pointSizeRange[0], pointSizeRange[1]);
			}
		}

		const glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(
			"attribute highp vec3 a_positionSize;\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(a_positionSize.xy, 0.0, 1.0);\n"
			"	gl_PointSize = a_positionSize.z;\n"
			"}\n",

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(gl_PointCoord, 0.0, 1.0);\n"
			"}\n"));

		log << program;

		if (!program.isOk())
			throw tcu::TestError("Compile failed");

		// Draw with GL.
		{
			glu::VertexArrayBinding	posBinding	= glu::va::Float("a_positionSize", 3, (int)coords.size(), 0, (const float*)&coords[0]);
			const int				viewportX	= rnd.getInt(0, m_context.getRenderTarget().getWidth()-width);
			const int				viewportY	= rnd.getInt(0, m_context.getRenderTarget().getHeight()-height);

			gl.viewport(viewportX, viewportY, width, height);
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);

			gl.useProgram(program.getProgram());

			glu::draw(m_context.getRenderContext(), program.getProgram(), 1, &posBinding,
					  glu::pr::Points((int)coords.size()));

			glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");
		}

		// Draw reference
		tcu::clear(refImg.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));
		for (vector<tcu::Vec3>::const_iterator pointIter = coords.begin(); pointIter != coords.end(); ++pointIter)
		{
			const int	x0		= deRoundFloatToInt32(float(width) *(pointIter->x()*0.5f + 0.5f) - pointIter->z()*0.5f);
			const int	y0		= deRoundFloatToInt32(float(height)*(pointIter->y()*0.5f + 0.5f) - pointIter->z()*0.5f);
			const int	x1		= deRoundFloatToInt32(float(width) *(pointIter->x()*0.5f + 0.5f) + pointIter->z()*0.5f);
			const int	y1		= deRoundFloatToInt32(float(height)*(pointIter->y()*0.5f + 0.5f) + pointIter->z()*0.5f);
			const int	w		= x1-x0;
			const int	h		= y1-y0;

			for (int yo = 0; yo < h; yo++)
			{
				for (int xo = 0; xo < w; xo++)
				{
					const float			xf		= (float(xo)+0.5f) / float(w);
					const float			yf		= (float(h-yo-1)+0.5f) / float(h);
					const tcu::Vec4		color	(xf, yf, 0.0f, 1.0f);
					const int			dx		= x0+xo;
					const int			dy		= y0+yo;

					if (de::inBounds(dx, 0, refImg.getWidth()) && de::inBounds(dy, 0, refImg.getHeight()))
						refImg.setPixel(dx, dy, tcu::RGBA(color));
				}
			}
		}

		// Compare
		{
			bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT);
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}